

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::remap_shader_module_handles<VkGraphicsPipelineCreateInfo>
          (Impl *this,VkGraphicsPipelineCreateInfo *info)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = info->stageCount == 0;
  if ((!bVar4) && (bVar1 = remap_shader_module_handle(this,info->pStages), bVar1)) {
    uVar3 = 0;
    lVar2 = 0x30;
    do {
      uVar3 = uVar3 + 1;
      bVar4 = info->stageCount <= uVar3;
      if (bVar4) {
        return bVar4;
      }
      bVar1 = remap_shader_module_handle
                        (this,(VkPipelineShaderStageCreateInfo *)
                              ((long)&info->pStages->sType + lVar2));
      lVar2 = lVar2 + 0x30;
    } while (bVar1);
  }
  return bVar4;
}

Assistant:

bool StateRecorder::Impl::remap_shader_module_handles(CreateInfo *info)
{
	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		auto &stage = const_cast<VkPipelineShaderStageCreateInfo &>(info->pStages[i]);
		if (!remap_shader_module_handle(stage))
			return false;
	}

	return true;
}